

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_cpscc(m68k_info *info)

{
  uint *puVar1;
  uint uVar2;
  cs_m68k *op;
  
  if ((info->type & 0x1c) != 0) {
    op = build_init_op(info,200,1,1);
    uVar2 = read_imm_16(info);
    puVar1 = &info->inst->Opcode;
    *puVar1 = *puVar1 + (uVar2 & 0x2f);
    get_ea_mode_op(info,op->operands,info->ir,1);
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_cpscc(m68k_info *info)
{
	cs_m68k* ext;

	LIMIT_CPU_TYPES(info, M68020_PLUS);
	ext = build_init_op(info, M68K_INS_FSF, 1, 1);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (read_imm_16(info) & 0x2f);

	get_ea_mode_op(info, &ext->operands[0], info->ir, 1);
}